

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListEGL.cpp
# Opt level: O3

void glcts::getConfigListEGL(Platform *platform,ApiType type,ConfigList *configList)

{
  pointer *ppAVar1;
  pointer *ppCVar2;
  pointer *ppEVar3;
  char *pcVar4;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  EGLint EVar11;
  EGLint EVar12;
  Exception *this;
  undefined4 extraout_var;
  AbstractFactory *pAVar13;
  NativeDisplay *nativeDisplay;
  Library *egl;
  EGLDisplay display;
  ulong uVar14;
  pointer ppvVar15;
  bool bVar16;
  bool bVar17;
  size_type __dnew;
  vector<void_*,_std::allocator<void_*>_> configs;
  undefined1 local_c0 [20];
  EGLint EStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  EGLint local_a0;
  EGLint EStack_9c;
  uint local_94;
  EGLint local_90;
  uint local_8c;
  undefined4 local_88;
  uint local_84;
  ConfigList *local_80;
  size_type local_78;
  EGLint local_70;
  EGLint local_6c;
  EGLint local_68;
  EGLint local_64;
  EGLint local_60;
  EGLint local_5c;
  vector<void_*,_std::allocator<void_*>_> local_58;
  vector<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_> *local_40;
  vector<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_> *local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((int)type.m_bits < 0x13) {
    if (type.m_bits == 2) {
      uVar9 = 4;
      goto LAB_00d89b29;
    }
    if (type.m_bits == 3) goto LAB_00d89ab3;
  }
  else if ((type.m_bits == 0x13) || (type.m_bits == 0x23)) {
LAB_00d89ab3:
    uVar9 = 0x40;
    goto LAB_00d89b29;
  }
  uVar9 = 8;
  if ((type.m_bits & 0x300) != 0x100) {
    this = (Exception *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Unsupported context type","");
    tcu::Exception::Exception(this,(string *)local_c0);
    __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
  }
LAB_00d89b29:
  iVar8 = (*platform->_vptr_Platform[4])();
  pAVar13 = tcu::GenericFactoryRegistry::getFactoryByIndex
                      ((GenericFactoryRegistry *)(CONCAT44(extraout_var,iVar8) + 8),0);
  iVar8 = (*pAVar13->_vptr_AbstractFactory[3])(pAVar13);
  nativeDisplay = (NativeDisplay *)CONCAT44(extraout_var_00,iVar8);
  iVar8 = (*nativeDisplay->_vptr_NativeDisplay[2])(nativeDisplay);
  egl = (Library *)CONCAT44(extraout_var_01,iVar8);
  display = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  eglu::getConfigs(&local_58,egl,display);
  pcVar4 = local_c0 + 0x10;
  local_78 = 0x1a;
  local_c0._0_8_ = pcVar4;
  local_c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_c0,(ulong)&local_78);
  stack0xffffffffffffff50 = local_78;
  builtin_strncpy((char *)local_c0._0_8_,"EGL_EXT_pixel_format_float",0x1a);
  local_c0._8_8_ = local_78;
  *(char *)(local_c0._0_8_ + local_78) = '\0';
  bVar6 = eglu::hasExtension(egl,display,(string *)local_c0);
  if ((char *)local_c0._0_8_ != pcVar4) {
    operator_delete((void *)local_c0._0_8_,stack0xffffffffffffff50 + 1);
  }
  local_78 = 0x13;
  local_c0._0_8_ = pcVar4;
  local_c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_c0,(ulong)&local_78);
  stack0xffffffffffffff50 = local_78;
  builtin_strncpy((char *)local_c0._0_8_,"EGL_EXT_yuv_surface",0x13);
  local_c0._8_8_ = local_78;
  *(char *)(local_c0._0_8_ + local_78) = '\0';
  bVar7 = eglu::hasExtension(egl,display,(string *)local_c0);
  local_8c = uVar9;
  if ((char *)local_c0._0_8_ != pcVar4) {
    operator_delete((void *)local_c0._0_8_,stack0xffffffffffffff50 + 1);
  }
  if (local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_38 = &configList->aospConfigs;
    local_40 = &configList->excludedConfigs;
    ppvVar15 = local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_80 = configList;
    do {
      local_90 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3028);
      uVar9 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3040);
      uVar10 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3042);
      local_5c = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3024);
      local_60 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3023);
      local_64 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3022);
      local_68 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3021);
      local_6c = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3025);
      local_70 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3026);
      EVar11 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3031);
      bVar16 = (uVar9 & local_8c) != 0;
      bVar17 = (uVar10 & local_8c) != 0;
      local_84 = uVar9;
      if (bVar6) {
        EVar12 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3339);
        local_94 = CONCAT31((int3)((uint)EVar12 >> 8),EVar12 == 0x333b);
        uVar9 = local_94;
      }
      else {
        local_94 = 0;
        uVar9 = local_8c;
      }
      uVar14 = CONCAT71((uint7)(uint3)(uVar9 >> 8),1);
      if (bVar7) {
        EVar12 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x303f);
        uVar14 = (ulong)CONCAT31((int3)((uint)EVar12 >> 8),EVar12 != 0x3300);
      }
      local_88 = 0;
      if ((((local_84 & local_8c) != 0) && ((uVar10 & local_8c) != 0)) && (EVar11 == 0)) {
        local_88 = (undefined4)CONCAT71((int7)(uVar14 >> 8),(byte)uVar14 & ((byte)local_94 ^ 1));
      }
      EVar12 = eglu::getConfigAttribInt(egl,display,*ppvVar15,0x3033);
      bVar5 = (byte)EVar12 << 4;
      uVar9 = CONCAT31(0,(byte)((bVar5 | (byte)EVar12 >> 4) * '\x02' & 0x40 |
                               ((bVar5 & 0x10) << 2 | (bVar5 & 0x40) >> 2) * '\x02') >> 5);
      if (bVar16 && bVar17) {
        local_c0._4_4_ = local_90;
        local_c0._0_4_ = 1;
        local_c0._12_4_ = local_5c;
        local_c0._8_4_ = uVar9;
        EStack_ac = local_64;
        local_c0._16_4_ = local_60;
        uStack_a8 = local_68;
        uStack_a4 = local_6c;
        local_a0 = local_70;
        __position._M_current =
             (local_80->aospConfigs).
             super__Vector_base<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_>._M_impl.
             super__Vector_impl_data._M_finish;
        EStack_9c = EVar11;
        if (__position._M_current ==
            (local_80->aospConfigs).
            super__Vector_base<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_>::
          _M_realloc_insert<glcts::AOSPConfig>(local_38,__position,(AOSPConfig *)local_c0);
        }
        else {
          (__position._M_current)->stencilBits = local_70;
          (__position._M_current)->samples = EVar11;
          (__position._M_current)->greenBits = local_60;
          (__position._M_current)->blueBits = local_64;
          (__position._M_current)->alphaBits = local_68;
          (__position._M_current)->depthBits = local_6c;
          (__position._M_current)->type = 1;
          (__position._M_current)->id = local_90;
          (__position._M_current)->surfaceTypes = uVar9;
          (__position._M_current)->redBits = local_5c;
          ppAVar1 = &(local_80->aospConfigs).
                     super__Vector_base<glcts::AOSPConfig,_std::allocator<glcts::AOSPConfig>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      if ((char)local_88 == '\0') {
        local_c0._8_4_ = EXCLUDEREASON_YUV - (local_94 & 0xff);
        if (EVar11 != 0) {
          local_c0._8_4_ = EXCLUDEREASON_MSAA;
        }
        if (!bVar16 || !bVar17) {
          local_c0._8_4_ = ZEXT14((local_8c & local_84) != 0);
        }
        local_c0._4_4_ = local_90;
        local_c0._0_4_ = 1;
        __position_01._M_current =
             (local_80->excludedConfigs).
             super__Vector_base<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_01._M_current ==
            (local_80->excludedConfigs).
            super__Vector_base<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_>::
          _M_realloc_insert<glcts::ExcludedConfig>
                    (local_40,__position_01,(ExcludedConfig *)local_c0);
        }
        else {
          (__position_01._M_current)->reason = local_c0._8_4_;
          (__position_01._M_current)->type = 1;
          (__position_01._M_current)->id = local_90;
          ppEVar3 = &(local_80->excludedConfigs).
                     super__Vector_base<glcts::ExcludedConfig,_std::allocator<glcts::ExcludedConfig>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppEVar3 = *ppEVar3 + 1;
        }
      }
      else {
        local_c0._4_4_ = local_90;
        local_c0._0_4_ = 1;
        local_c0._8_4_ = uVar9;
        __position_00._M_current =
             (local_80->configs).super__Vector_base<glcts::Config,_std::allocator<glcts::Config>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (local_80->configs).super__Vector_base<glcts::Config,_std::allocator<glcts::Config>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<glcts::Config,_std::allocator<glcts::Config>_>::
          _M_realloc_insert<glcts::Config>(&local_80->configs,__position_00,(Config *)local_c0);
        }
        else {
          (__position_00._M_current)->surfaceTypes = uVar9;
          (__position_00._M_current)->type = 1;
          (__position_00._M_current)->id = local_90;
          ppCVar2 = &(local_80->configs).
                     super__Vector_base<glcts::Config,_std::allocator<glcts::Config>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppCVar2 = *ppCVar2 + 1;
        }
      }
      ppvVar15 = ppvVar15 + 1;
    } while (ppvVar15 !=
             local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*nativeDisplay->_vptr_NativeDisplay[1])(nativeDisplay);
  return;
}

Assistant:

void getConfigListEGL(tcu::Platform& platform, glu::ApiType type, ConfigList& configList)
{
	try
	{
		getDefaultEglConfigList(platform, type, configList);
	}
	catch (const std::bad_cast&)
	{
		throw tcu::Exception("Platform is not tcu::EglPlatform");
	}
}